

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O3

nh_objitem * make_invlist(char *lets,int *icount)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  obj *obj;
  int idx;
  int idx_00;
  int nr_items;
  nh_objitem *items;
  int *local_38;
  
  nr_items = 10;
  local_38 = icount;
  items = (nh_objitem *)malloc(0xb68);
  idx = 0;
  pcVar4 = flags.inv_order;
  do {
    pcVar3 = pcVar4;
    if (invent != (obj *)0x0) {
      bVar2 = false;
      obj = invent;
      do {
        cVar1 = obj->invlet;
        if ((lets == (char *)0x0) || (*lets == '\0')) {
LAB_001b1589:
          idx_00 = idx;
          if (flags.sortpack != '\0') {
            if (obj->oclass != *pcVar3) goto LAB_001b161c;
            if (!bVar2) {
              idx_00 = idx + 1;
              pcVar4 = let_to_name(obj->oclass,'\0');
              add_objitem(&items,&nr_items,MI_HEADING,idx,0,pcVar4,obj,'\0');
              bVar2 = true;
            }
          }
          examine_object(obj);
          idx = idx_00 + 1;
          pcVar4 = doname(obj);
          add_objitem(&items,&nr_items,MI_NORMAL,idx_00,(int)cVar1,pcVar4,obj,'\x01');
        }
        else {
          pcVar4 = strchr(lets,(int)cVar1);
          if (pcVar4 != (char *)0x0) goto LAB_001b1589;
        }
LAB_001b161c:
        obj = obj->nobj;
      } while (obj != (obj *)0x0);
    }
    if ((flags.sortpack == '\0') ||
       ((pcVar4 = pcVar3 + 1, pcVar3[1] == '\0' && (pcVar4 = "\x11", pcVar3 == "\x11")))) {
      *local_38 = idx;
      return items;
    }
  } while( true );
}

Assistant:

static struct nh_objitem *make_invlist(const char *lets, int *icount)
{
	struct obj *otmp;
	char ilet;
	int nr_items = 10, cur_entry = 0, classcount;
	const char *invlet = flags.inv_order;
	struct nh_objitem *items = malloc(nr_items * sizeof(struct nh_objitem));

nextclass:
	classcount = 0;
	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    ilet = otmp->invlet;
	    if (!lets || !*lets || strchr(lets, ilet)) {
		if (!flags.sortpack || otmp->oclass == *invlet) {
		    if (flags.sortpack && !classcount) {
			add_objitem(&items, &nr_items, MI_HEADING, cur_entry++, 0,
				    let_to_name(*invlet, FALSE), otmp, FALSE);
			classcount++;
		    }
		    examine_object(otmp);
		    add_objitem(&items, &nr_items, MI_NORMAL, cur_entry++, ilet,
				doname(otmp), otmp, TRUE);
		}
	    }
	}
	if (flags.sortpack) {
		if (*++invlet)
			goto nextclass;
		if (--invlet != venom_inv) {
			invlet = venom_inv;
			goto nextclass;
		}
	}

	*icount = cur_entry;
	return items;
}